

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

void __thiscall
WorkQueue<CMU462::WorkItem>::put_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *item)

{
  WorkItem *item_local;
  WorkQueue<CMU462::WorkItem> *this_local;
  
  std::mutex::lock(&this->lock);
  std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::push_back(&this->storage,item);
  std::mutex::unlock(&this->lock);
  return;
}

Assistant:

void put_work(const T& item) {
      lock.lock();
      storage.push_back(item);
      lock.unlock();
    }